

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::SimpleAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,
          Type *elementType,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  SourceLocation SVar1;
  long in_RDX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  SimpleAssignmentPatternExpression *result;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  bool bad;
  bool isLValue;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_000000d0;
  bitwidth_t in_stack_000000dc;
  size_t in_stack_000000e0;
  Type *in_stack_000000e8;
  Type *in_stack_000000f0;
  undefined1 in_stack_00000110 [16];
  bool *in_stack_00000120;
  Expression *in_stack_ffffffffffffff48;
  Scope *expr;
  Compilation *in_stack_ffffffffffffff50;
  Compilation *compilation;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff58;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff60;
  ASTContext *this;
  SourceLocation in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  DiagCode code;
  Scope *args_3;
  Compilation *args_2;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar3;
  bitmask<slang::ast::ASTFlags> local_40;
  undefined1 local_31;
  SimpleAssignmentPatternExpression *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0);
  this = (ASTContext *)&stack0x00000008;
  SVar1 = (SourceLocation)(in_RDX + 0x10);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_40,LValue);
  local_31 = bitmask<slang::ast::ASTFlags>::has(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
  ;
  if ((bool)local_31) {
    sourceRange_00.endLoc = in_stack_ffffffffffffff78;
    sourceRange_00.startLoc = SVar1;
    ASTContext::addDiag(this,code,sourceRange_00);
    local_8 = (SimpleAssignmentPatternExpression *)
              Expression::badExpr(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    bVar3 = 0;
    expr = (this->scope).ptr;
    compilation = *(Compilation **)&this->lookupIndex;
    args_3 = expr;
    args_2 = compilation;
    sVar2 = bindExpressionList(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                               in_stack_000000dc,in_stack_000000d0,(ASTContext *)sourceRange.endLoc,
                               (SourceRange)in_stack_00000110,in_stack_00000120);
    local_8 = BumpAllocator::
              emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                        ((BumpAllocator *)CONCAT17(bVar3,in_stack_ffffffffffffffa0),
                         (Type *)sVar2._M_extent._M_extent_value._M_extent_value,
                         (bool *)sVar2._M_ptr,
                         (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)args_2
                         ,(SourceRange *)args_3);
    if ((bVar3 & 1) != 0) {
      local_8 = (SimpleAssignmentPatternExpression *)
                Expression::badExpr(compilation,(Expression *)expr);
    }
  }
  return (Expression *)local_8;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    const bool isLValue = context.flags.has(ASTFlags::LValue);
    if (isLValue) {
        context.addDiag(diag::AssignmentPatternLValueDynamic, sourceRange);
        return badExpr(comp, nullptr);
    }

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, 1, 0, syntax.items, context, sourceRange,
                                    bad);

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, isLValue, elems,
                                                                  sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}